

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rigid-body-kinematics.hxx
# Opt level: O0

Matrix3 * __thiscall stateObservation::kine::Orientation::toMatrix3(Orientation *this)

{
  bool bVar1;
  Matrix<double,_3,_3,_0,_3,_3> *pMVar2;
  Orientation *this_local;
  
  check_(this);
  bVar1 = isMatrixSet(this);
  if (!bVar1) {
    quaternionToMatrix_(this);
  }
  pMVar2 = CheckedItem::operator_cast_to_Matrix_((CheckedItem *)&this->m_);
  return pMVar2;
}

Assistant:

inline const Matrix3 & Orientation::toMatrix3() const
{
  check_();
  if(!isMatrixSet())
  {
    quaternionToMatrix_();
  }
  return m_;
}